

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::Pow::dim_forward
          (Dim *__return_storage_ptr__,Pow *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer __file;
  uint uVar1;
  ostream *os;
  invalid_argument *this_00;
  __off_t __length;
  Dim local_1c0;
  Dim r;
  
  __file = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)__file != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x307,"virtual Dim cnn::Pow::dim_forward(const vector<Dim> &) const");
  }
  Dim::truncate(__return_storage_ptr__,(char *)__file,(__off_t)xs);
  Dim::truncate(&local_1c0,
                (char *)((xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1),__length);
  r.d[0] = local_1c0.d[0];
  r.d[1] = local_1c0.d[1];
  r.d[2] = local_1c0.d[2];
  r.d[3] = local_1c0.d[3];
  r.d[4] = local_1c0.d[4];
  r.d[5] = local_1c0.d[5];
  r.d[6] = local_1c0.d[6];
  r.nd = local_1c0.nd;
  r.bd = 1;
  uVar1 = Dim::size(&r);
  if (uVar1 == 1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
  os = std::operator<<((ostream *)&r,"Bad input dimensions in Pow: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)&local_1c0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}